

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O2

int ncnn::gru(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint _h;
  int iVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  void *pvVar9;
  void *pvVar10;
  int *piVar11;
  long lVar12;
  void *pvVar13;
  int i;
  uint uVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  void *pvVar22;
  float *pfVar23;
  long lVar24;
  void *pvVar25;
  ulong uVar26;
  void *pvVar27;
  void *pvVar28;
  ulong uVar29;
  long lVar30;
  void *pvVar31;
  long lVar32;
  void *pvVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  int local_170;
  Mat local_98;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  _h = top_blob->w;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  Mat::create(&local_98,2,_h,4,opt->workspace_allocator);
  pvVar13 = local_98.data;
  local_170 = -100;
  if ((local_98.data != (void *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
    pvVar5 = bottom_blob->data;
    iVar3 = bottom_blob->w;
    sVar6 = bottom_blob->elemsize;
    pvVar7 = top_blob->data;
    iVar4 = top_blob->w;
    sVar8 = top_blob->elemsize;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    local_170 = 0;
    uVar26 = (ulong)_h;
    if ((int)_h < 1) {
      uVar26 = 0;
    }
    uVar20 = 0;
    if (0 < (int)uVar2) {
      uVar20 = uVar2;
    }
    pfVar15 = (float *)((long)local_98.data + 4);
    for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
      uVar14 = ~uVar21 + uVar2;
      if (reverse == 0) {
        uVar14 = uVar21;
      }
      lVar24 = (long)iVar3 * sVar6 * (long)(int)uVar14;
      lVar16 = (long)local_98.w;
      lVar12 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
      pvVar9 = bias_c->data;
      lVar17 = (long)bias_c->w * bias_c->elemsize;
      pvVar27 = weight_xc->data;
      pvVar28 = weight_hc->data;
      lVar30 = (long)weight_xc->w * weight_xc->elemsize;
      pvVar22 = (void *)(lVar30 * (int)_h + (long)pvVar27);
      lVar32 = (long)weight_hc->w * weight_hc->elemsize;
      pvVar25 = (void *)(lVar32 * (int)_h + (long)pvVar28);
      pvVar33 = (void *)(lVar32 * (int)(_h * 2) + (long)pvVar28);
      pvVar31 = (void *)(lVar30 * (int)(_h * 2) + (long)pvVar27);
      for (uVar29 = 0; uVar29 != uVar26; uVar29 = uVar29 + 1) {
        lVar18 = lVar16 * lVar12 * uVar29;
        fStack_44 = *(float *)((long)pvVar9 + uVar29 * 4);
        local_48 = *(float *)((long)pvVar9 + uVar29 * 4 + lVar17);
        fStack_40 = 0.0;
        fStack_3c = 0.0;
        for (uVar19 = 0; uVar1 != uVar19; uVar19 = uVar19 + 1) {
          fVar36 = *(float *)((long)pvVar5 + uVar19 * 4 + lVar24);
          local_48 = local_48 + fVar36 * *(float *)((long)pvVar22 + uVar19 * 4);
          fStack_44 = fStack_44 + fVar36 * *(float *)((long)pvVar27 + uVar19 * 4);
          fStack_40 = fStack_40 + fVar36 * 0.0;
          fStack_3c = fStack_3c + fVar36 * 0.0;
        }
        pvVar10 = hidden_state->data;
        for (uVar19 = 0; _h != uVar19; uVar19 = uVar19 + 1) {
          fVar36 = *(float *)((long)pvVar10 + uVar19 * 4);
          local_48 = local_48 + fVar36 * *(float *)((long)pvVar25 + uVar19 * 4);
          fStack_44 = fStack_44 + fVar36 * *(float *)((long)pvVar28 + uVar19 * 4);
          fStack_40 = fStack_40 + fVar36 * 0.0;
          fStack_3c = fStack_3c + fVar36 * 0.0;
        }
        fVar34 = expf(-fStack_44);
        fVar35 = expf(-local_48);
        fVar36 = *(float *)((long)pvVar9 + uVar29 * 4 + lVar17 * 3);
        for (uVar19 = 0; _h != uVar19; uVar19 = uVar19 + 1) {
          fVar36 = fVar36 + *(float *)((long)pvVar33 + uVar19 * 4) *
                            *(float *)((long)pvVar10 + uVar19 * 4);
        }
        fVar36 = fVar36 / (fVar34 + 1.0) + *(float *)((long)pvVar9 + uVar29 * 4 + lVar17 * 2);
        for (uVar19 = 0; uVar1 != uVar19; uVar19 = uVar19 + 1) {
          fVar36 = fVar36 + *(float *)((long)pvVar31 + uVar19 * 4) *
                            *(float *)((long)pvVar5 + uVar19 * 4 + lVar24);
        }
        fVar36 = tanhf(fVar36);
        *(float *)((long)pvVar13 + lVar18) = 1.0 / (fVar35 + 1.0);
        *(float *)((long)pvVar13 + lVar18 + 4) = fVar36;
        pvVar22 = (void *)((long)pvVar22 + lVar30);
        pvVar27 = (void *)((long)pvVar27 + lVar30);
        pvVar25 = (void *)((long)pvVar25 + lVar32);
        pvVar28 = (void *)((long)pvVar28 + lVar32);
        pvVar33 = (void *)((long)pvVar33 + lVar32);
        pvVar31 = (void *)((long)pvVar31 + lVar30);
      }
      pvVar9 = hidden_state->data;
      pfVar23 = pfVar15;
      for (uVar29 = 0; uVar26 != uVar29; uVar29 = uVar29 + 1) {
        fVar36 = (*(float *)((long)pvVar9 + uVar29 * 4) - *pfVar23) * pfVar23[-1] + *pfVar23;
        *(float *)((long)pvVar9 + uVar29 * 4) = fVar36;
        *(float *)((long)pvVar7 + uVar29 * 4 + (long)(int)uVar14 * (long)iVar4 * sVar8) = fVar36;
        pfVar23 = (float *)((long)pfVar23 +
                           (long)local_98.w *
                           CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
      }
    }
  }
  piVar11 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_170;
}

Assistant:

static int gru(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 2 x num_output
    Mat gates(2, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float* gates_data = gates.row(q);

            // gate reset update
            const float* bias_c_R = bias_c.row(0);
            const float* bias_c_U = bias_c.row(1);

            const float* weight_xc_R = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_U = weight_xc.row(num_output * 1 + q);
            const float* weight_hc_R = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_U = weight_hc.row(num_output * 1 + q);

            float R = bias_c_R[q];
            float U = bias_c_U[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                R += weight_xc_R[i] * xi;
                U += weight_xc_U[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                R += weight_hc_R[i] * h_cont;
                U += weight_hc_U[i] * h_cont;
            }

            // sigmoid(R)
            // sigmoid(U)
            R = 1.f / (1.f + exp(-R));
            U = 1.f / (1.f + exp(-U));

            // gate new
            const float* bias_c_WN = bias_c.row(2);
            const float* bias_c_BN = bias_c.row(3);

            const float* weight_xc_N = weight_xc.row(num_output * 2 + q);
            const float* weight_hc_N = weight_hc.row(num_output * 2 + q);

            float N = bias_c_BN[q];

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                N += weight_hc_N[i] * h_cont;
            }

            N = bias_c_WN[q] + R * N;

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                N += weight_xc_N[i] * xi;
            }

            // tanh(N)
            N = tanh(N);

            gates_data[0] = U;
            gates_data[1] = N;
        }

        // h_t := (1 - update) .* new + update .* h_{t-1}
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float U = gates_data[0];
            float N = gates_data[1];

            float H = (1 - U) * N + U * hidden_state[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}